

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

void __thiscall QRasterPaintEngine::opacityChanged(QRasterPaintEngine *this)

{
  QRasterPaintEngineState *pQVar1;
  QRasterPaintEngineState *s;
  
  pQVar1 = state((QRasterPaintEngine *)0x5629b7);
  pQVar1->fillFlags = pQVar1->fillFlags | 0x1000;
  pQVar1->strokeFlags = pQVar1->strokeFlags | 0x1000;
  pQVar1->pixmapFlags = pQVar1->pixmapFlags | 0x1000;
  pQVar1->dirty = pQVar1->dirty | 0x1000;
  pQVar1->intOpacity = (int)((pQVar1->super_QPainterState).opacity * 256.0);
  return;
}

Assistant:

void QRasterPaintEngine::opacityChanged()
{
    QRasterPaintEngineState *s = state();

#ifdef QT_DEBUG_DRAW
    qDebug() << "QRasterPaintEngine::opacityChanged()" << s->opacity;
#endif

    s->fillFlags |= DirtyOpacity;
    s->strokeFlags |= DirtyOpacity;
    s->pixmapFlags |= DirtyOpacity;
    s->dirty |= DirtyOpacity;
    s->intOpacity = (int) (s->opacity * 256);
}